

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(defV *data,vector<double,_std::allocator<double>_> *val)

{
  pointer pdVar1;
  pointer pcVar2;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__x;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar6;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__x_00;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  uint *puVar8;
  complex<double> *cval;
  pointer __z;
  string_view val_00;
  string_view val_01;
  _Vector_base<double,_std::allocator<double>_> local_40;
  pointer local_28;
  
  std::vector<double,_std::allocator<double>_>::resize(val,0);
  puVar8 = &switchD_001c3ca3::switchdataD_00337ff0;
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    __x = std::
          get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                    (data);
    std::vector<double,_std::allocator<double>_>::push_back(val,__x);
    return;
  case '\x01':
    pvVar6 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    local_40._M_impl.super__Vector_impl_data._M_start = (pointer)(double)*pvVar6;
    break;
  default:
    pvVar5 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    val_01._M_str = (pvVar5->_M_dataplus)._M_p;
    val_01._M_len = pvVar5->_M_string_length;
    helicsGetVector(val_01,val);
    return;
  case '\x03':
    pvVar3 = std::
             get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    local_40._M_impl.super__Vector_impl_data._M_start = *(pointer *)pvVar3->_M_value;
    local_28 = *(pointer *)(pvVar3->_M_value + 8);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(val,(double *)&local_40);
    local_40._M_impl.super__Vector_impl_data._M_start = local_28;
    if (((double)local_28 == 0.0) && (!NAN((double)local_28))) {
      return;
    }
    break;
  case '\x04':
    __x_00 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    std::vector<double,_std::allocator<double>_>::operator=(val,__x_00);
    return;
  case '\x05':
    pvVar7 = std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    std::vector<double,_std::allocator<double>_>::reserve
              (val,(long)(pvVar7->
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar7->
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4);
    pdVar1 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish != pdVar1) {
      (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pdVar1;
    }
    pcVar2 = (pvVar7->
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (__z = (pvVar7->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start; __z != pcVar2; __z = __z + 1) {
      if ((*(double *)(__z->_M_value + 8) != 0.0) || (NAN(*(double *)(__z->_M_value + 8)))) {
        local_40._M_impl.super__Vector_impl_data._M_start = (pointer)std::abs<double>(__z);
      }
      else {
        local_40._M_impl.super__Vector_impl_data._M_start = *(pointer *)__z->_M_value;
      }
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(val,(double *)&local_40);
    }
    return;
  case '\x06':
    pvVar4 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    if (!NAN(pvVar4->value)) {
      std::vector<double,_std::allocator<double>_>::resize(val,1);
      *(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
       _M_start = pvVar4->value;
      return;
    }
    val_00._M_str = (char *)puVar8;
    val_00._M_len = (size_t)(pvVar4->name)._M_dataplus._M_p;
    helicsGetVector((vector<double,_std::allocator<double>_> *)&local_40,
                    (helics *)(pvVar4->name)._M_string_length,val_00);
    CLI::std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)val,&local_40);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
    return;
  }
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(val,(double *)&local_40);
  return;
}

Assistant:

void valueExtract(const defV& data, std::vector<double>& val)
{
    val.resize(0);
    switch (data.index()) {
        case double_loc:  // double
            val.push_back(std::get<double>(data));
            break;
        case int_loc:  // int64_t
            val.push_back(static_cast<double>(std::get<int64_t>(data)));
            break;
        case string_loc:  // string
        default:
            helicsGetVector(std::get<std::string>(data), val);
            break;
        case complex_loc:  // complex
        {
            const std::complex<double> cval = std::get<std::complex<double>>(data);
            val.push_back(cval.real());
            if (cval.imag() != 0.0) {
                val.push_back(cval.imag());
            }
        } break;
        case vector_loc:  // vector
            val = std::get<std::vector<double>>(data);
            break;
        case complex_vector_loc:  // complex
        {
            const auto& cvec = std::get<std::vector<std::complex<double>>>(data);
            val.reserve(cvec.size());
            val.clear();
            for (const auto& cval : cvec) {
                if (cval.imag() == 0.0) {
                    val.push_back(cval.real());
                } else {
                    val.push_back(std::abs(cval));
                }
            }
        } break;
        case named_point_loc:  // named point
        {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                val = helicsGetVector(point.name);
            } else {
                val.resize(1);
                val[0] = point.value;
            }
            break;
        }
    }
}